

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O3

void isobusfs_dump_tx_data(isobusfs_buf_log *buffer)

{
  isobusfs_buf_log *piVar1;
  char *__s;
  long lVar2;
  ulong uVar3;
  char data_str [24];
  char local_48 [24];
  
  uVar3 = 0;
  piVar1 = buffer;
  do {
    __s = local_48;
    local_48[0] = '\0';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_48[0x14] = '\0';
    local_48[0x15] = '\0';
    local_48[0x16] = '\0';
    local_48[0x17] = '\0';
    lVar2 = 0;
    do {
      snprintf(__s,4,"%02X ",(ulong)piVar1->entries[0].data[lVar2]);
      lVar2 = lVar2 + 1;
      __s = __s + 3;
    } while (lVar2 != 8);
    isobusfs_log(LOG_LEVEL_DEBUG,"Entry %u: %s Timestamp: %ld.%09ld\n",uVar3 & 0xffffffff,local_48,
                 buffer->entries[uVar3].ts.tv_sec,buffer->entries[uVar3].ts.tv_nsec);
    uVar3 = uVar3 + 1;
    piVar1 = (isobusfs_buf_log *)(piVar1->entries + 1);
  } while (uVar3 != 10);
  return;
}

Assistant:

void isobusfs_dump_tx_data(const struct isobusfs_buf_log *buffer)
{
	uint i;

	for (i = 0; i < ISOBUSFS_MAX_BUF_ENTRIES; ++i) {
		const struct isobusfs_buf *entry = &buffer->entries[i];
		char data_str[ISOBUSFS_MIN_TRANSFER_LENGH * 3] = {0};
		uint j;

		for (j = 0; j < ISOBUSFS_MIN_TRANSFER_LENGH; ++j)
			snprintf(data_str + j * 3, 4, "%02X ", entry->data[j]);

		pr_debug("Entry %u: %s Timestamp: %ld.%09ld\n", i, data_str,
			 entry->ts.tv_sec, entry->ts.tv_nsec);
	}
}